

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

void llvm::cl::
     apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
               (opt<bool,_false,_llvm::cl::parser<bool>_> *O,OptionHidden *M,initializer<bool> *Ms,
               cat *Ms_1,sub *Ms_2)

{
  bool *pbVar1;
  pair<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>,_bool> pStack_18;
  
  *(ushort *)&(O->super_Option).field_0xc =
       (ushort)*(undefined4 *)&(O->super_Option).field_0xc & 0xff9f |
       (ushort)((*M & (ReallyHidden|Hidden)) << 5);
  pbVar1 = Ms->Init;
  (O->super_opt_storage<bool,_false,_false>).Value = *pbVar1;
  (O->super_opt_storage<bool,_false,_false>).Default.super_OptionValueBase<bool,_false>.
  super_OptionValueCopy<bool>.Valid = true;
  (O->super_opt_storage<bool,_false,_false>).Default.super_OptionValueBase<bool,_false>.
  super_OptionValueCopy<bool>.Value = *pbVar1;
  (O->super_Option).Category = Ms_1->Category;
  SmallPtrSetImpl<llvm::cl::SubCommand_*>::insert
            (&pStack_18,&(O->super_Option).Subs.super_SmallPtrSetImpl<llvm::cl::SubCommand_*>,
             Ms_2->Sub);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}